

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzprinteg.h
# Opt level: O3

void __thiscall
TPZPrInteg<TPZInt1Point>::Point(TPZPrInteg<TPZInt1Point> *this,int ip,TPZVec<double> *pos,REAL *w)

{
  ulong uVar1;
  int iVar2;
  long *plVar3;
  int i;
  int extraout_EDX;
  int i_00;
  TPZGaussRule *__return_storage_ptr__;
  longdouble in_ST0;
  longdouble in_ST1;
  
  __return_storage_ptr__ = this->fIntP;
  iVar2 = ip / __return_storage_ptr__->fNumInt;
  uVar1 = (long)ip % (long)__return_storage_ptr__->fNumInt;
  i = (int)uVar1;
  if (iVar2 == 0) {
    *w = 1.0;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"TPZInt1Point:: Bad number point ",0x20);
    plVar3 = (long *)std::ostream::operator<<(&std::cout,iVar2);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
    __return_storage_ptr__ = this->fIntP;
    i = extraout_EDX;
  }
  TPZGaussRule::Loc((longdouble *)__return_storage_ptr__,(TPZGaussRule *)(uVar1 & 0xffffffff),i);
  *pos->fStore = (double)in_ST0;
  TPZGaussRule::W((longdouble *)this->fIntP,(TPZGaussRule *)(uVar1 & 0xffffffff),i_00);
  *w = (double)(in_ST1 * (longdouble)*w);
  return;
}

Assistant:

void Point(int ip, TPZVec<REAL> &pos, REAL &w) const override
    {
		int ipf = ip/fIntP->NInt();
		int iploc = ip%(fIntP->NInt());
		TFather::Point(ipf,pos,w);
		pos[Dim-1] = fIntP->Loc(iploc);
		w *= fIntP->W(iploc);
    }